

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O1

bool operator<(sockaddr_in *addr,sockaddr_in *addr2)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = addr->sin_family < addr2->sin_family;
  if ((addr->sin_family == addr2->sin_family) &&
     (uVar1 = (addr2->sin_addr).s_addr, uVar2 = (addr->sin_addr).s_addr, bVar3 = uVar2 < uVar1,
     uVar2 == uVar1)) {
    bVar3 = addr->sin_port < addr2->sin_port;
  }
  return bVar3;
}

Assistant:

bool operator<(const struct sockaddr_in &addr, const struct sockaddr_in &addr2) {
	if (addr.sin_family != addr2.sin_family)
		return (addr.sin_family < addr2.sin_family);
	if (addr.sin_addr.s_addr != addr2.sin_addr.s_addr)
		return (addr.sin_addr.s_addr < addr2.sin_addr.s_addr);
	if (addr.sin_port != addr2.sin_port)
		return (addr.sin_port < addr2.sin_port);
	return false;
}